

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorInit(VP8Encoder *enc,VP8EncIterator *it)

{
  uint8_t *puVar1;
  
  it->enc_ = enc;
  puVar1 = (uint8_t *)((ulong)(it->yuv_mem_ + 0x1f) & 0xffffffffffffffe0);
  it->yuv_in_ = puVar1;
  it->yuv_out_ = puVar1 + 0x200;
  it->yuv_out2_ = puVar1 + 0x400;
  it->yuv_p_ = puVar1 + 0x600;
  it->lf_stats_ = enc->lf_stats_;
  it->percent0_ = enc->percent_;
  puVar1 = (uint8_t *)((ulong)(it->yuv_left_mem_ + 0x20) & 0xffffffffffffffe0);
  it->y_left_ = puVar1;
  it->u_left_ = puVar1 + 0x20;
  it->v_left_ = puVar1 + 0x30;
  it->top_derr_ = enc->top_derr_;
  VP8IteratorReset(it);
  return;
}

Assistant:

void VP8IteratorInit(VP8Encoder* const enc, VP8EncIterator* const it) {
  it->enc_ = enc;
  it->yuv_in_   = (uint8_t*)WEBP_ALIGN(it->yuv_mem_);
  it->yuv_out_  = it->yuv_in_ + YUV_SIZE_ENC;
  it->yuv_out2_ = it->yuv_out_ + YUV_SIZE_ENC;
  it->yuv_p_    = it->yuv_out2_ + YUV_SIZE_ENC;
  it->lf_stats_ = enc->lf_stats_;
  it->percent0_ = enc->percent_;
  it->y_left_ = (uint8_t*)WEBP_ALIGN(it->yuv_left_mem_ + 1);
  it->u_left_ = it->y_left_ + 16 + 16;
  it->v_left_ = it->u_left_ + 16;
  it->top_derr_ = enc->top_derr_;
  VP8IteratorReset(it);
}